

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

bool benchmark::ParseStringFlag(char *str,char *flag,string *value)

{
  char *pcVar1;
  string *in_RDX;
  char *value_str;
  bool in_stack_0000008f;
  char *in_stack_00000090;
  char *in_stack_00000098;
  
  pcVar1 = ParseFlagValue(in_stack_00000098,in_stack_00000090,in_stack_0000008f);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=(in_RDX,pcVar1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool ParseStringFlag(const char* str, const char* flag, std::string* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  *value = value_str;
  return true;
}